

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# proto3_arena_unittest.cc
# Opt level: O0

void __thiscall
google::protobuf::anon_unknown_0::Proto3OptionalTest_OptionalField_Test::
Proto3OptionalTest_OptionalField_Test(Proto3OptionalTest_OptionalField_Test *this)

{
  Proto3OptionalTest_OptionalField_Test *this_local;
  
  testing::Test::Test(&this->super_Test);
  (this->super_Test)._vptr_Test = (_func_int **)&PTR__Proto3OptionalTest_OptionalField_Test_029e37b0
  ;
  return;
}

Assistant:

TEST(Proto3OptionalTest, OptionalField) {
  proto2_unittest::TestProto3Optional msg;
  EXPECT_FALSE(msg.has_optional_int32());
  msg.set_optional_int32(0);
  EXPECT_TRUE(msg.has_optional_int32());

  std::string serialized;
  msg.SerializeToString(&serialized);
  EXPECT_GT(serialized.size(), 0);

  msg.clear_optional_int32();
  EXPECT_FALSE(msg.has_optional_int32());
  msg.SerializeToString(&serialized);
  EXPECT_EQ(serialized.size(), 0);
}